

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O1

aiMesh * __thiscall Assimp::IFC::TempMesh::ToMesh(TempMesh *this)

{
  double dVar1;
  uint uVar2;
  pointer paVar3;
  pointer paVar4;
  uint *puVar5;
  ulong uVar6;
  aiMesh *paVar7;
  aiVector3D *__s;
  long lVar8;
  ulong *puVar9;
  aiFace *paVar10;
  uint *puVar11;
  aiFace *paVar12;
  uint *puVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> mesh;
  
  paVar3 = (this->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar4 = (this->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar15 = (long)paVar4 - (long)paVar3;
  uVar16 = ((long)uVar15 / 6 + ((long)uVar15 >> 0x3f) >> 2) - ((long)uVar15 >> 0x3f);
  puVar5 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = 0;
  puVar11 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start;
  for (puVar13 = puVar11; puVar13 != puVar5; puVar13 = puVar13 + 1) {
    uVar6 = uVar6 + *puVar13;
  }
  if (uVar16 == uVar6) {
    paVar7 = (aiMesh *)0x0;
    if (paVar3 != paVar4) {
      paVar7 = (aiMesh *)operator_new(0x520);
      paVar7->mPrimitiveTypes = 0;
      paVar7->mNumVertices = 0;
      paVar7->mNumFaces = 0;
      memset(&paVar7->mVertices,0,0xcc);
      paVar7->mBones = (aiBone **)0x0;
      paVar7->mMaterialIndex = 0;
      (paVar7->mName).length = 0;
      (paVar7->mName).data[0] = '\0';
      memset((paVar7->mName).data + 1,0x1b,0x3ff);
      paVar7->mNumAnimMeshes = 0;
      paVar7->mAnimMeshes = (aiAnimMesh **)0x0;
      paVar7->mMethod = 0;
      (paVar7->mAABB).mMin.x = 0.0;
      (paVar7->mAABB).mMin.y = 0.0;
      (paVar7->mAABB).mMin.z = 0.0;
      (paVar7->mAABB).mMax.x = 0.0;
      (paVar7->mAABB).mMax.y = 0.0;
      (paVar7->mAABB).mMax.z = 0.0;
      paVar7->mTextureCoords[0] = (aiVector3D *)0x0;
      paVar7->mTextureCoords[1] = (aiVector3D *)0x0;
      paVar7->mTextureCoords[2] = (aiVector3D *)0x0;
      paVar7->mTextureCoords[3] = (aiVector3D *)0x0;
      paVar7->mTextureCoords[4] = (aiVector3D *)0x0;
      paVar7->mTextureCoords[5] = (aiVector3D *)0x0;
      paVar7->mTextureCoords[6] = (aiVector3D *)0x0;
      paVar7->mTextureCoords[7] = (aiVector3D *)0x0;
      paVar7->mNumUVComponents[0] = 0;
      paVar7->mNumUVComponents[1] = 0;
      paVar7->mNumUVComponents[2] = 0;
      paVar7->mNumUVComponents[3] = 0;
      paVar7->mNumUVComponents[4] = 0;
      paVar7->mNumUVComponents[5] = 0;
      paVar7->mNumUVComponents[6] = 0;
      paVar7->mNumUVComponents[7] = 0;
      paVar7->mColors[0] = (aiColor4D *)0x0;
      paVar7->mColors[1] = (aiColor4D *)0x0;
      paVar7->mColors[2] = (aiColor4D *)0x0;
      paVar7->mColors[3] = (aiColor4D *)0x0;
      paVar7->mColors[4] = (aiColor4D *)0x0;
      paVar7->mColors[5] = (aiColor4D *)0x0;
      paVar7->mColors[6] = (aiColor4D *)0x0;
      paVar7->mColors[7] = (aiColor4D *)0x0;
      paVar7->mNumVertices = (uint)uVar16;
      __s = (aiVector3D *)operator_new__((uVar16 & 0xffffffff) * 0xc);
      if ((uint)uVar16 != 0) {
        memset(__s,0,(((uVar16 & 0xffffffff) * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar7->mVertices = __s;
      if (0 < (long)uVar15) {
        lVar14 = uVar15 / 0x18 + 1;
        lVar8 = 0;
        do {
          dVar1 = *(double *)((long)&paVar3->z + lVar8 * 2);
          *(ulong *)((long)&__s->x + lVar8) =
               CONCAT44((float)*(double *)((long)&paVar3->y + lVar8 * 2),
                        (float)*(double *)((long)&paVar3->x + lVar8 * 2));
          *(float *)((long)&__s->z + lVar8) = (float)dVar1;
          lVar8 = lVar8 + 0xc;
          lVar14 = lVar14 + -1;
        } while (1 < lVar14);
      }
      uVar6 = (ulong)((long)puVar5 - (long)puVar11) >> 2;
      uVar18 = (uint)uVar6;
      paVar7->mNumFaces = uVar18;
      uVar6 = uVar6 & 0xffffffff;
      puVar9 = (ulong *)operator_new__(uVar6 * 0x10 + 8);
      *puVar9 = uVar6;
      paVar10 = (aiFace *)(puVar9 + 1);
      if (uVar18 != 0) {
        paVar12 = paVar10;
        do {
          paVar12->mNumIndices = 0;
          paVar12->mIndices = (uint *)0x0;
          paVar12 = paVar12 + 1;
        } while (paVar12 != paVar10 + uVar6);
      }
      paVar7->mFaces = paVar10;
      uVar18 = paVar7->mNumFaces;
      if (uVar18 != 0) {
        iVar17 = 0;
        uVar6 = 0;
        uVar15 = 0;
        do {
          uVar2 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar6];
          if ((ulong)uVar2 == 0) {
            paVar7->mNumFaces = uVar18 - 1;
          }
          else {
            paVar10 = paVar7->mFaces + uVar15;
            paVar10->mNumIndices = uVar2;
            puVar11 = (uint *)operator_new__((ulong)uVar2 << 2);
            paVar10->mIndices = puVar11;
            if (paVar10->mNumIndices != 0) {
              uVar16 = 0;
              do {
                paVar10->mIndices[uVar16] = iVar17 + (int)uVar16;
                uVar16 = uVar16 + 1;
              } while (uVar16 < paVar10->mNumIndices);
              iVar17 = iVar17 + (int)uVar16;
            }
            uVar15 = (ulong)((int)uVar15 + 1);
          }
          uVar6 = (ulong)((int)uVar6 + 1);
          uVar18 = paVar7->mNumFaces;
        } while ((uint)uVar15 < uVar18);
      }
    }
    return paVar7;
  }
  __assert_fail("mVerts.size() == std::accumulate(mVertcnt.begin(),mVertcnt.end(),size_t(0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCUtil.cpp"
                ,0x47,"aiMesh *Assimp::IFC::TempMesh::ToMesh()");
}

Assistant:

aiMesh* TempMesh::ToMesh()
{
    ai_assert(mVerts.size() == std::accumulate(mVertcnt.begin(),mVertcnt.end(),size_t(0)));

    if (mVerts.empty()) {
        return NULL;
    }

    std::unique_ptr<aiMesh> mesh(new aiMesh());

    // copy vertices
    mesh->mNumVertices = static_cast<unsigned int>(mVerts.size());
    mesh->mVertices = new aiVector3D[mesh->mNumVertices];
    std::copy(mVerts.begin(),mVerts.end(),mesh->mVertices);

    // and build up faces
    mesh->mNumFaces = static_cast<unsigned int>(mVertcnt.size());
    mesh->mFaces = new aiFace[mesh->mNumFaces];

    for(unsigned int i = 0,n=0, acc = 0; i < mesh->mNumFaces; ++n) {
        aiFace& f = mesh->mFaces[i];
        if (!mVertcnt[n]) {
            --mesh->mNumFaces;
            continue;
        }

        f.mNumIndices = mVertcnt[n];
        f.mIndices = new unsigned int[f.mNumIndices];
        for(unsigned int a = 0; a < f.mNumIndices; ++a) {
            f.mIndices[a] = acc++;
        }

        ++i;
    }

    return mesh.release();
}